

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O0

int PEM_write_bio(BIO *bp,char *name,char *hdr,uchar *data,long len)

{
  int iVar1;
  size_t sVar2;
  int local_98;
  int local_90;
  int retval;
  int reason;
  EVP_ENCODE_CTX ctx;
  uchar *buf;
  int local_40;
  int outl;
  int j;
  int i;
  int n;
  int nlen;
  long len_local;
  uchar *data_local;
  char *header_local;
  char *name_local;
  BIO *bp_local;
  
  ctx.data[0x2c] = '\0';
  ctx.data[0x2d] = '\0';
  ctx.data[0x2e] = '\0';
  ctx.data[0x2f] = '\0';
  ctx.eof_seen = '\0';
  ctx.error_encountered = '\0';
  ctx._54_2_ = 0;
  local_90 = 0;
  _n = len;
  len_local = (long)data;
  data_local = (uchar *)hdr;
  header_local = name;
  name_local = (char *)bp;
  EVP_EncodeInit((EVP_ENCODE_CTX *)&retval);
  sVar2 = strlen(header_local);
  i = (int)sVar2;
  iVar1 = BIO_write((BIO *)name_local,"-----BEGIN ",0xb);
  if (((iVar1 == 0xb) && (iVar1 = BIO_write((BIO *)name_local,header_local,i), iVar1 == i)) &&
     (iVar1 = BIO_write((BIO *)name_local,"-----\n",6), iVar1 == 6)) {
    sVar2 = strlen((char *)data_local);
    outl = (int)sVar2;
    if (((outl < 1) ||
        ((iVar1 = BIO_write((BIO *)name_local,data_local,outl), iVar1 == outl &&
         (iVar1 = BIO_write((BIO *)name_local,"\n",1), iVar1 == 1)))) &&
       (ctx._48_8_ = OPENSSL_malloc(0x2000), (void *)ctx._48_8_ != (void *)0x0)) {
      local_40 = 0;
      outl = 0;
      for (; 0 < _n; _n = _n - j) {
        if (_n < 0x1401) {
          local_98 = (int)_n;
        }
        else {
          local_98 = 0x1400;
        }
        j = local_98;
        EVP_EncodeUpdate((EVP_ENCODE_CTX *)&retval,(uchar *)ctx._48_8_,(int *)((long)&buf + 4),
                         (uchar *)(len_local + local_40),local_98);
        if ((buf._4_4_ != 0) &&
           (iVar1 = BIO_write((BIO *)name_local,(void *)ctx._48_8_,buf._4_4_), iVar1 != buf._4_4_))
        goto LAB_00743211;
        outl = buf._4_4_ + outl;
        local_40 = j + local_40;
      }
      EVP_EncodeFinal((EVP_ENCODE_CTX *)&retval,(uchar *)ctx._48_8_,(int *)((long)&buf + 4));
      if ((((buf._4_4_ < 1) ||
           (iVar1 = BIO_write((BIO *)name_local,(void *)ctx._48_8_,buf._4_4_), iVar1 == buf._4_4_))
          && (iVar1 = BIO_write((BIO *)name_local,"-----END ",9), iVar1 == 9)) &&
         ((iVar1 = BIO_write((BIO *)name_local,header_local,i), iVar1 == i &&
          (iVar1 = BIO_write((BIO *)name_local,"-----\n",6), iVar1 == 6)))) {
        local_90 = outl + buf._4_4_;
      }
    }
  }
LAB_00743211:
  if (local_90 == 0) {
    ERR_put_error(9,0,7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                  ,0x215);
  }
  OPENSSL_free((void *)ctx._48_8_);
  return local_90;
}

Assistant:

int PEM_write_bio(BIO *bp, const char *name, const char *header,
                  const unsigned char *data, long len) {
  int nlen, n, i, j, outl;
  unsigned char *buf = NULL;
  EVP_ENCODE_CTX ctx;
  int reason = ERR_R_BUF_LIB;
  int retval = 0;

  EVP_EncodeInit(&ctx);
  nlen = strlen(name);

  if ((BIO_write(bp, "-----BEGIN ", 11) != 11) ||
      (BIO_write(bp, name, nlen) != nlen) ||
      (BIO_write(bp, "-----\n", 6) != 6)) {
    goto err;
  }

  i = strlen(header);
  if (i > 0) {
    if ((BIO_write(bp, header, i) != i) || (BIO_write(bp, "\n", 1) != 1)) {
      goto err;
    }
  }

  buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(PEM_BUFSIZE * 8));
  if (buf == NULL) {
    goto err;
  }

  i = j = 0;
  while (len > 0) {
    n = (int)((len > (PEM_BUFSIZE * 5)) ? (PEM_BUFSIZE * 5) : len);
    EVP_EncodeUpdate(&ctx, buf, &outl, &(data[j]), n);
    if ((outl) && (BIO_write(bp, (char *)buf, outl) != outl)) {
      goto err;
    }
    i += outl;
    len -= n;
    j += n;
  }
  EVP_EncodeFinal(&ctx, buf, &outl);
  if ((outl > 0) && (BIO_write(bp, (char *)buf, outl) != outl)) {
    goto err;
  }
  if ((BIO_write(bp, "-----END ", 9) != 9) ||
      (BIO_write(bp, name, nlen) != nlen) ||
      (BIO_write(bp, "-----\n", 6) != 6)) {
    goto err;
  }
  retval = i + outl;

err:
  if (retval == 0) {
    OPENSSL_PUT_ERROR(PEM, reason);
  }
  OPENSSL_free(buf);
  return retval;
}